

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O3

size_t Open_JTalk_get_fperiod(Open_JTalk *open_jtalk,_Bool *error)

{
  if (error == (_Bool *)0x0) {
    if (open_jtalk != (Open_JTalk *)0x0) goto LAB_00145984;
  }
  else {
    *error = false;
    if (open_jtalk != (Open_JTalk *)0x0) {
LAB_00145984:
      return (open_jtalk->engine).condition.fperiod;
    }
    *error = true;
  }
  return 0;
}

Assistant:

size_t Open_JTalk_get_fperiod(Open_JTalk *open_jtalk, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return open_jtalk->engine.condition.fperiod;
}